

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

bool duckdb::ZSTDStorage::StringAnalyze(AnalyzeState *state_p,Vector *input,idx_t count)

{
  BlockManager *pBVar1;
  _func_int **pp_Var2;
  idx_t iVar3;
  idx_t iVar4;
  UnifiedVectorFormat vdata;
  UnifiedVectorFormat local_70;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
  Vector::ToUnifiedFormat(input,count,&local_70);
  for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
    iVar4 = iVar3;
    if ((local_70.sel)->sel_vector != (sel_t *)0x0) {
      iVar4 = (idx_t)(local_70.sel)->sel_vector[iVar3];
    }
    if ((local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar4 >> 6] >>
         (iVar4 & 0x3f) & 1) != 0)) {
      state_p[2]._vptr_AnalyzeState =
           (_func_int **)
           ((long)state_p[2]._vptr_AnalyzeState + (ulong)*(uint *)(local_70.data + iVar4 * 0x10));
    }
  }
  pBVar1 = (BlockManager *)((long)&(state_p[4].info.block_manager)->_vptr_BlockManager + count);
  while (state_p[4].info.block_manager = pBVar1, (BlockManager *)0x7ff < pBVar1) {
    pp_Var2 = state_p[4]._vptr_AnalyzeState;
    iVar3 = GetWritableSpace(&state_p->info);
    if (iVar3 < ((long)pp_Var2 * 0x14 + 0x1bU & 0xfffffffffffffff8) + (long)pp_Var2 * 8 + 8) {
      state_p[3]._vptr_AnalyzeState = state_p[4]._vptr_AnalyzeState;
      state_p[3].info.block_manager =
           (BlockManager *)((long)&(state_p[3].info.block_manager)->_vptr_BlockManager + 1);
      pp_Var2 = (_func_int **)0x0;
    }
    else {
      pp_Var2 = (_func_int **)((long)state_p[4]._vptr_AnalyzeState + 1);
    }
    state_p[4]._vptr_AnalyzeState = pp_Var2;
    pBVar1 = (BlockManager *)&state_p[4].info.block_manager[-0x10].block_header_size;
  }
  state_p[2].info.block_manager =
       (BlockManager *)((long)&(state_p[2].info.block_manager)->_vptr_BlockManager + count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_70);
  return true;
}

Assistant:

bool ZSTDStorage::StringAnalyze(AnalyzeState &state_p, Vector &input, idx_t count) {
	auto &state = state_p.Cast<ZSTDAnalyzeState>();
	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);

	auto data = UnifiedVectorFormat::GetData<string_t>(vdata);
	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);
		if (!vdata.validity.RowIsValid(idx)) {
			continue;
		}
		auto &str = data[idx];
		auto string_size = str.GetSize();
		state.total_size += string_size;
	}
	state.values_in_vector += count;
	while (state.values_in_vector >= ZSTD_VECTOR_SIZE) {
		if (GetVectorMetadataSize(state.vectors_in_segment + 1) > GetWritableSpace(state.info)) {
			state.vectors_per_segment = state.vectors_in_segment;
			state.segment_count++;
			state.vectors_in_segment = 0;
		} else {
			state.vectors_in_segment++;
		}
		state.values_in_vector -= ZSTD_VECTOR_SIZE;
	}
	state.count += count;
	return true;
}